

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MenuBar.cpp
# Opt level: O0

void __thiscall gui::MenuBar::draw(MenuBar *this,RenderTarget *target,RenderStates states)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  uint uVar5;
  element_type *peVar6;
  const_reference pvVar7;
  element_type *peVar8;
  const_iterator this_00;
  reference drawable;
  Text *in_RSI;
  Widget *in_RDI;
  MenuItem *menuItem_1;
  const_iterator __end2;
  const_iterator __begin2;
  vector<gui::MenuItem,_std::allocator<gui::MenuItem>_> *__range2;
  value_type *menuItem;
  value_type *menu_1;
  MenuList *menu;
  const_iterator __end1;
  const_iterator __begin1;
  vector<gui::MenuList,_std::allocator<gui::MenuList>_> *__range1;
  Text *in_stack_fffffffffffffea8;
  Text *in_stack_fffffffffffffeb0;
  MenuBar *in_stack_fffffffffffffeb8;
  Color *color;
  Text *in_stack_fffffffffffffec0;
  Text *this_01;
  Drawable *in_stack_ffffffffffffff88;
  RenderTarget *in_stack_ffffffffffffff90;
  __normal_iterator<const_gui::MenuItem_*,_std::vector<gui::MenuItem,_std::allocator<gui::MenuItem>_>_>
  local_68;
  vector<gui::MenuItem,_std::allocator<gui::MenuItem>_> *local_60;
  Vector2<float> local_58;
  const_reference local_50;
  Vector2f local_48;
  const_reference local_40;
  reference local_38;
  MenuList *local_30;
  __normal_iterator<const_gui::MenuList_*,_std::vector<gui::MenuList,_std::allocator<gui::MenuList>_>_>
  local_28;
  Vector2f *local_20;
  Vector2<float> local_18;
  Text *local_10;
  
  local_10 = in_RSI;
  bVar4 = Widget::isVisible(in_RDI);
  if (bVar4) {
    Widget::getTransform((Widget *)0x19c272);
    sf::operator*=((Transform *)in_stack_fffffffffffffeb0,(Transform *)in_stack_fffffffffffffea8);
    std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x19c29a);
    sf::RectangleShape::setSize
              ((RectangleShape *)in_stack_fffffffffffffeb0,(Vector2f *)in_stack_fffffffffffffea8);
    std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x19c2d9);
    sf::RenderTarget::draw
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(RenderStates *)in_RDI);
    if (in_RDI[1].transformable_.m_scale.y != -NAN) {
      std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x19c31e);
      std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x19c340);
      sf::Shape::setFillColor((Shape *)in_stack_fffffffffffffeb0,(Color *)in_stack_fffffffffffffea8)
      ;
      peVar6 = std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x19c36b);
      pvVar7 = std::vector<gui::MenuList,_std::allocator<gui::MenuList>_>::operator[]
                         ((vector<gui::MenuList,_std::allocator<gui::MenuList>_> *)
                          &in_RDI[1].transformable_.m_origin,
                          (long)(int)in_RDI[1].transformable_.m_scale.y);
      fVar1 = (pvVar7->labelPosition_).x;
      peVar8 = std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x19c3c1);
      sf::Transformable::setPosition
                (&(peVar6->highlight_).super_Shape.super_Transformable,
                 fVar1 - (peVar8->barTextPadding_).x,0.0);
      std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x19c3f6);
      peVar6 = std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x19c418);
      fVar1 = (peVar6->barTextPadding_).x;
      pvVar7 = std::vector<gui::MenuList,_std::allocator<gui::MenuList>_>::operator[]
                         ((vector<gui::MenuList,_std::allocator<gui::MenuList>_> *)
                          &in_RDI[1].transformable_.m_origin,
                          (long)(int)in_RDI[1].transformable_.m_scale.y);
      sf::Vector2<float>::Vector2
                (&local_18,fVar1 + fVar1 + pvVar7->labelWidth_,
                 *(float *)&in_RDI[1].transformable_._vptr_Transformable);
      sf::RectangleShape::setSize
                ((RectangleShape *)in_stack_fffffffffffffeb0,(Vector2f *)in_stack_fffffffffffffea8);
      std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x19c4b9);
      sf::RenderTarget::draw
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(RenderStates *)in_RDI);
    }
    std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x19c4ec);
    std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x19c50e);
    sf::Text::setFillColor(in_stack_fffffffffffffec0,(Color *)in_stack_fffffffffffffeb8);
    local_20 = &in_RDI[1].transformable_.m_origin;
    local_28._M_current =
         (MenuList *)
         std::vector<gui::MenuList,_std::allocator<gui::MenuList>_>::begin
                   ((vector<gui::MenuList,_std::allocator<gui::MenuList>_> *)
                    in_stack_fffffffffffffea8);
    local_30 = (MenuList *)
               std::vector<gui::MenuList,_std::allocator<gui::MenuList>_>::end
                         ((vector<gui::MenuList,_std::allocator<gui::MenuList>_> *)
                          in_stack_fffffffffffffea8);
    while (bVar4 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_gui::MenuList_*,_std::vector<gui::MenuList,_std::allocator<gui::MenuList>_>_>
                               *)in_stack_fffffffffffffeb0,
                              (__normal_iterator<const_gui::MenuList_*,_std::vector<gui::MenuList,_std::allocator<gui::MenuList>_>_>
                               *)in_stack_fffffffffffffea8), bVar4) {
      local_38 = __gnu_cxx::
                 __normal_iterator<const_gui::MenuList_*,_std::vector<gui::MenuList,_std::allocator<gui::MenuList>_>_>
                 ::operator*(&local_28);
      std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x19c5ac);
      sf::Text::setString(in_stack_fffffffffffffeb0,(String *)in_stack_fffffffffffffea8);
      std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x19c5d7);
      sf::Transformable::setPosition
                ((Transformable *)in_stack_fffffffffffffeb0,(Vector2f *)in_stack_fffffffffffffea8);
      std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x19c61a);
      sf::RenderTarget::draw
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(RenderStates *)in_RDI);
      __gnu_cxx::
      __normal_iterator<const_gui::MenuList_*,_std::vector<gui::MenuList,_std::allocator<gui::MenuList>_>_>
      ::operator++(&local_28);
    }
    if (((uint)in_RDI[1].transformable_.m_transform.m_matrix[0] & 1) != 0) {
      local_40 = std::vector<gui::MenuList,_std::allocator<gui::MenuList>_>::operator[]
                           ((vector<gui::MenuList,_std::allocator<gui::MenuList>_> *)
                            &in_RDI[1].transformable_.m_origin,
                            (long)(int)in_RDI[1].transformable_.m_scale.y);
      std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x19c69f);
      sf::RectangleShape::setSize
                ((RectangleShape *)in_stack_fffffffffffffeb0,(Vector2f *)in_stack_fffffffffffffea8);
      std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x19c6c4);
      local_48 = getOpenMenuPosition(in_stack_fffffffffffffeb8);
      sf::Transformable::setPosition
                ((Transformable *)in_stack_fffffffffffffeb0,(Vector2f *)in_stack_fffffffffffffea8);
      std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x19c71b);
      sf::RenderTarget::draw
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(RenderStates *)in_RDI);
      if (local_40->selectedItem_ != -1) {
        local_50 = std::vector<gui::MenuItem,_std::allocator<gui::MenuItem>_>::operator[]
                             (&local_40->items,(long)local_40->selectedItem_);
        std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x19c785);
        if ((local_50->enabled & 1U) == 0) {
          std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x19c7d3);
        }
        else {
          std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x19c7b2);
        }
        sf::Shape::setFillColor
                  ((Shape *)in_stack_fffffffffffffeb0,(Color *)in_stack_fffffffffffffea8);
        peVar6 = std::
                 __shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x19c806);
        fVar1 = (local_50->leftPosition_).x;
        peVar8 = std::
                 __shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x19c82e);
        fVar2 = (peVar8->menuTextPadding_).x;
        fVar3 = (local_50->leftPosition_).y;
        peVar8 = std::
                 __shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x19c863);
        sf::Transformable::setPosition
                  (&(peVar6->highlight_).super_Shape.super_Transformable,fVar1 - fVar2,
                   fVar3 - (peVar8->menuTextPadding_).y);
        std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x19c88f);
        fVar1 = (local_40->menuSize_).x;
        peVar6 = std::
                 __shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x19c8b7);
        fVar2 = (peVar6->menuTextPadding_).y;
        peVar6 = std::
                 __shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x19c8cf);
        fVar3 = (peVar6->menuTextPadding_).z;
        std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x19c8e7);
        uVar5 = MenuBarStyle::getCharacterSize((MenuBarStyle *)0x19c8ef);
        sf::Vector2<float>::Vector2(&local_58,fVar1,fVar2 + fVar2 + fVar3 * (float)uVar5);
        sf::RectangleShape::setSize
                  ((RectangleShape *)in_stack_fffffffffffffeb0,(Vector2f *)in_stack_fffffffffffffea8
                  );
        std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x19c954);
        sf::RenderTarget::draw
                  (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(RenderStates *)in_RDI);
      }
      local_60 = &local_40->items;
      local_68._M_current =
           (MenuItem *)
           std::vector<gui::MenuItem,_std::allocator<gui::MenuItem>_>::begin
                     ((vector<gui::MenuItem,_std::allocator<gui::MenuItem>_> *)
                      in_stack_fffffffffffffea8);
      this_00 = std::vector<gui::MenuItem,_std::allocator<gui::MenuItem>_>::end
                          ((vector<gui::MenuItem,_std::allocator<gui::MenuItem>_> *)
                           in_stack_fffffffffffffea8);
      while (bVar4 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_gui::MenuItem_*,_std::vector<gui::MenuItem,_std::allocator<gui::MenuItem>_>_>
                                 *)in_stack_fffffffffffffeb0,
                                (__normal_iterator<const_gui::MenuItem_*,_std::vector<gui::MenuItem,_std::allocator<gui::MenuItem>_>_>
                                 *)in_stack_fffffffffffffea8), bVar4) {
        drawable = __gnu_cxx::
                   __normal_iterator<const_gui::MenuItem_*,_std::vector<gui::MenuItem,_std::allocator<gui::MenuItem>_>_>
                   ::operator*(&local_68);
        peVar6 = std::
                 __shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x19c9f5);
        this_01 = &peVar6->text_;
        if ((drawable->enabled & 1U) == 0) {
          peVar6 = std::
                   __shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x19ca43);
          color = &peVar6->disabledTextColor_;
        }
        else {
          peVar6 = std::
                   __shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x19ca22);
          color = &peVar6->textColor_;
        }
        sf::Text::setFillColor(this_01,color);
        std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x19ca71);
        sf::Text::setString(in_stack_fffffffffffffeb0,(String *)in_stack_fffffffffffffea8);
        std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x19ca9c);
        sf::Transformable::setPosition
                  ((Transformable *)in_stack_fffffffffffffeb0,(Vector2f *)in_stack_fffffffffffffea8)
        ;
        in_stack_fffffffffffffea8 = local_10;
        std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x19cadb);
        sf::RenderTarget::draw
                  ((RenderTarget *)this_00._M_current,(Drawable *)drawable,(RenderStates *)in_RDI);
        std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x19cb0a);
        sf::Text::setString(in_stack_fffffffffffffeb0,(String *)in_stack_fffffffffffffea8);
        std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x19cb39);
        sf::Transformable::setPosition
                  ((Transformable *)in_stack_fffffffffffffeb0,(Vector2f *)in_stack_fffffffffffffea8)
        ;
        in_stack_fffffffffffffeb0 = local_10;
        std::__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x19cb79);
        sf::RenderTarget::draw
                  ((RenderTarget *)this_00._M_current,(Drawable *)drawable,(RenderStates *)in_RDI);
        __gnu_cxx::
        __normal_iterator<const_gui::MenuItem_*,_std::vector<gui::MenuItem,_std::allocator<gui::MenuItem>_>_>
        ::operator++(&local_68);
      }
    }
  }
  return;
}

Assistant:

void MenuBar::draw(sf::RenderTarget& target, sf::RenderStates states) const {
    if (!isVisible()) {
        return;
    }
    states.transform *= getTransform();

    style_->bar_.setSize(barSize_);
    target.draw(style_->bar_, states);
    if (selectedMenu_ != -1) {
        style_->highlight_.setFillColor(style_->highlightColor_);
        style_->highlight_.setPosition(menus_[selectedMenu_].labelPosition_.x - style_->barTextPadding_.x, 0.0f);
        style_->highlight_.setSize({2.0f * style_->barTextPadding_.x + menus_[selectedMenu_].labelWidth_, barSize_.y});
        target.draw(style_->highlight_, states);
    }

    style_->text_.setFillColor(style_->textColor_);
    for (const auto& menu : menus_) {
        style_->text_.setString(menu.name);
        style_->text_.setPosition(menu.labelPosition_);
        target.draw(style_->text_, states);
    }

    if (menuIsOpen_) {
        const auto& menu = menus_[selectedMenu_];
        style_->menu_.setSize(menu.menuSize_);
        style_->menu_.setPosition(getOpenMenuPosition());
        target.draw(style_->menu_, states);

        if (menu.selectedItem_ != -1) {
            const auto& menuItem = menu.items[menu.selectedItem_];
            style_->highlight_.setFillColor(menuItem.enabled ? style_->highlightColor_ : style_->disabledHighlightColor_);
            style_->highlight_.setPosition(menuItem.leftPosition_.x - style_->menuTextPadding_.x, menuItem.leftPosition_.y - style_->menuTextPadding_.y);
            style_->highlight_.setSize({menu.menuSize_.x, 2.0f * style_->menuTextPadding_.y + style_->menuTextPadding_.z * style_->getCharacterSize()});
            target.draw(style_->highlight_, states);
        }

        for (const auto& menuItem : menu.items) {
            style_->text_.setFillColor(menuItem.enabled ? style_->textColor_ : style_->disabledTextColor_);
            style_->text_.setString(menuItem.leftText);
            style_->text_.setPosition(menuItem.leftPosition_);
            target.draw(style_->text_, states);
            style_->text_.setString(menuItem.rightText);
            style_->text_.setPosition(menuItem.rightPosition_);
            target.draw(style_->text_, states);
        }
    }
}